

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_passModel(void *highs,HighsInt num_col,HighsInt num_row,HighsInt num_nz,
                        HighsInt q_num_nz,HighsInt a_format,HighsInt q_format,HighsInt sense,
                        double offset,double *col_cost,double *col_lower,double *col_upper,
                        double *row_lower,double *row_upper,HighsInt *a_start,HighsInt *a_index,
                        double *a_value,HighsInt *q_start,HighsInt *q_index,double *q_value,
                        HighsInt *integrality)

{
  HighsStatus HVar1;
  double in_stack_00000738;
  HighsInt in_stack_00000744;
  HighsInt in_stack_00000748;
  HighsInt in_stack_0000074c;
  HighsInt in_stack_00000750;
  HighsInt in_stack_00000754;
  Highs *in_stack_00000758;
  HighsInt in_stack_00000770;
  HighsInt in_stack_00000778;
  double *in_stack_00000780;
  double *in_stack_00000788;
  double *in_stack_00000790;
  double *in_stack_00000798;
  double *in_stack_000007a0;
  HighsInt *in_stack_000007a8;
  HighsInt *in_stack_000007b0;
  double *in_stack_000007b8;
  HighsInt *in_stack_000007c0;
  HighsInt *in_stack_000007c8;
  double *in_stack_000007d0;
  HighsInt *in_stack_000007d8;
  
  HVar1 = Highs::passModel(in_stack_00000758,in_stack_00000754,in_stack_00000750,in_stack_0000074c,
                           in_stack_00000748,in_stack_00000744,in_stack_00000770,in_stack_00000778,
                           in_stack_00000738,in_stack_00000780,in_stack_00000788,in_stack_00000790,
                           in_stack_00000798,in_stack_000007a0,in_stack_000007a8,in_stack_000007b0,
                           in_stack_000007b8,in_stack_000007c0,in_stack_000007c8,in_stack_000007d0,
                           in_stack_000007d8);
  return HVar1;
}

Assistant:

HighsInt Highs_passModel(void* highs, const HighsInt num_col,
                         const HighsInt num_row, const HighsInt num_nz,
                         const HighsInt q_num_nz, const HighsInt a_format,
                         const HighsInt q_format, const HighsInt sense,
                         const double offset, const double* col_cost,
                         const double* col_lower, const double* col_upper,
                         const double* row_lower, const double* row_upper,
                         const HighsInt* a_start, const HighsInt* a_index,
                         const double* a_value, const HighsInt* q_start,
                         const HighsInt* q_index, const double* q_value,
                         const HighsInt* integrality) {
  return (HighsInt)((Highs*)highs)
      ->passModel(num_col, num_row, num_nz, q_num_nz, a_format, q_format, sense,
                  offset, col_cost, col_lower, col_upper, row_lower, row_upper,
                  a_start, a_index, a_value, q_start, q_index, q_value,
                  integrality);
}